

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestRunTest.cxx
# Opt level: O0

void __thiscall cmCTestRunTest::ParseOutputForMeasurements(cmCTestRunTest *this)

{
  bool bVar1;
  ulong uVar2;
  long lVar3;
  char *replace;
  string local_50;
  string local_30;
  cmCTestRunTest *local_10;
  cmCTestRunTest *this_local;
  
  local_10 = this;
  uVar2 = std::__cxx11::string::empty();
  if (((uVar2 & 1) == 0) &&
     (((lVar3 = std::__cxx11::string::find((char *)&this->ProcessOutput,0xd1e352), lVar3 != -1 ||
       (lVar3 = std::__cxx11::string::find((char *)&this->ProcessOutput,0xd1e363), lVar3 != -1)) &&
      (bVar1 = cmsys::RegularExpression::find
                         (&this->TestHandler->AllTestMeasurementsRegex,&this->ProcessOutput), bVar1)
      ))) {
    cmsys::RegularExpression::match_abi_cxx11_
              (&local_30,&this->TestHandler->AllTestMeasurementsRegex,1);
    std::__cxx11::string::operator=
              ((string *)&(this->TestResult).TestMeasurementsOutput,(string *)&local_30);
    std::__cxx11::string::~string((string *)&local_30);
    while (bVar1 = cmsys::RegularExpression::find
                             (&this->TestHandler->SingleTestMeasurementRegex,&this->ProcessOutput),
          bVar1) {
      cmsys::RegularExpression::match_abi_cxx11_
                (&local_50,&this->TestHandler->SingleTestMeasurementRegex,1);
      replace = (char *)std::__cxx11::string::c_str();
      cmsys::SystemTools::ReplaceString(&this->ProcessOutput,replace,"");
      std::__cxx11::string::~string((string *)&local_50);
    }
  }
  return;
}

Assistant:

void cmCTestRunTest::ParseOutputForMeasurements()
{
  if (!this->ProcessOutput.empty() &&
      (this->ProcessOutput.find("<DartMeasurement") != std::string::npos ||
       this->ProcessOutput.find("<CTestMeasurement") != std::string::npos)) {
    if (this->TestHandler->AllTestMeasurementsRegex.find(
          this->ProcessOutput)) {
      this->TestResult.TestMeasurementsOutput =
        this->TestHandler->AllTestMeasurementsRegex.match(1);
      // keep searching and replacing until none are left
      while (this->TestHandler->SingleTestMeasurementRegex.find(
        this->ProcessOutput)) {
        // replace the exact match for the string
        cmSystemTools::ReplaceString(
          this->ProcessOutput,
          this->TestHandler->SingleTestMeasurementRegex.match(1).c_str(), "");
      }
    }
  }
}